

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O1

void __thiscall
vkt::synchronization::anon_unknown_0::IndirectBuffer::ReadImplementation::recordCommands
          (ReadImplementation *this,VkCommandBuffer cmdBuffer)

{
  DeviceInterface *pDVar1;
  Pipeline *pPVar2;
  VkBufferMemoryBarrier barrier;
  
  pDVar1 = this->m_context->m_vk;
  pPVar2 = (this->m_pipeline).
           super_UniqueBase<vkt::synchronization::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::Pipeline>_>
           .m_data.ptr;
  (*pPVar2->_vptr_Pipeline[2])
            (pPVar2,this->m_context,cmdBuffer,
             (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
             m_internal);
  makeBufferMemoryBarrier
            (&barrier,0x40,0x2000,
             (VkBuffer)
             (((this->m_hostBuffer).
               super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
               .m_data.ptr)->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,this->m_hostBufferSizeBytes);
  (*pDVar1->_vptr_DeviceInterface[0x6d])
            (pDVar1,cmdBuffer,(ulong)this->m_pipelineStage,0x4000,0,0,0,1,&barrier,0,0);
  return;
}

Assistant:

void recordCommands (const VkCommandBuffer cmdBuffer)
	{
		const DeviceInterface&	vk	= m_context.getDeviceInterface();

		m_pipeline->recordCommands(m_context, cmdBuffer, *m_descriptorSet);

		// Insert a barrier so data written by the shader is available to the host
		const VkBufferMemoryBarrier	barrier = makeBufferMemoryBarrier(VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, **m_hostBuffer, 0u, m_hostBufferSizeBytes);
		vk.cmdPipelineBarrier(cmdBuffer, m_pipelineStage, VK_PIPELINE_STAGE_HOST_BIT, (VkDependencyFlags)0, 0u, DE_NULL, 1u, &barrier, 0u, DE_NULL);
	}